

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O0

bool __thiscall
slang::ast::GenericClassDefSymbol::SpecializationKey::operator==
          (SpecializationKey *this,SpecializationKey *other)

{
  ConstantValue *lhs;
  ConstantValue *rhs;
  Type *this_00;
  Type *rhs_00;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  iterator ppCVar4;
  iterator ppTVar5;
  Type *r_1;
  Type *l_1;
  iterator rit_1;
  iterator lit_1;
  ConstantValue *r;
  ConstantValue *l;
  iterator rit;
  iterator lit;
  SpecializationKey *other_local;
  SpecializationKey *this_local;
  
  if ((this->savedHash == other->savedHash) && (this->definition == other->definition)) {
    sVar2 = nonstd::span_lite::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::size
                      (&this->paramValues);
    sVar3 = nonstd::span_lite::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::size
                      (&other->paramValues);
    if (sVar2 == sVar3) {
      sVar2 = nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>::size
                        (&this->typeParams);
      sVar3 = nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>::size
                        (&other->typeParams);
      if (sVar2 == sVar3) {
        rit = nonstd::span_lite::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::
              begin(&this->paramValues);
        l = (ConstantValue *)
            nonstd::span_lite::span<const_slang::ConstantValue_*const,_18446744073709551615UL>::
            begin(&other->paramValues);
        for (; ppCVar4 = nonstd::span_lite::
                         span<const_slang::ConstantValue_*const,_18446744073709551615UL>::end
                                   (&this->paramValues), rit != ppCVar4; rit = rit + 1) {
          lhs = *rit;
          rhs = *(ConstantValue **)
                 &(l->value).
                  super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                  .
                  super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
          ;
          if ((lhs == (ConstantValue *)0x0) || (rhs == (ConstantValue *)0x0)) {
            if (lhs != rhs) {
              return false;
            }
          }
          else {
            bVar1 = slang::operator==(lhs,rhs);
            if (!bVar1) {
              return false;
            }
          }
          l = (ConstantValue *)
              ((long)&(l->value).
                      super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                      .
                      super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              + 8);
        }
        rit_1 = nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>::
                begin(&this->typeParams);
        l_1 = (Type *)nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>
                      ::begin(&other->typeParams);
        do {
          ppTVar5 = nonstd::span_lite::span<const_slang::ast::Type_*const,_18446744073709551615UL>::
                    end(&this->typeParams);
          if (rit_1 == ppTVar5) {
            return true;
          }
          this_00 = *rit_1;
          rhs_00 = *(Type **)&l_1->super_Symbol;
          if ((this_00 == (Type *)0x0) || (rhs_00 == (Type *)0x0)) {
            if (this_00 != rhs_00) {
              return false;
            }
          }
          else {
            bVar1 = Type::isMatching(this_00,rhs_00);
            if (!bVar1) {
              return false;
            }
          }
          rit_1 = rit_1 + 1;
          l_1 = (Type *)&(l_1->super_Symbol).name;
        } while( true );
      }
    }
  }
  return false;
}

Assistant:

bool GenericClassDefSymbol::SpecializationKey::operator==(const SpecializationKey& other) const {
    if (savedHash != other.savedHash || definition != other.definition ||
        paramValues.size() != other.paramValues.size() ||
        typeParams.size() != other.typeParams.size()) {
        return false;
    }

    for (auto lit = paramValues.begin(), rit = other.paramValues.begin(); lit != paramValues.end();
         lit++, rit++) {
        const ConstantValue* l = *lit;
        const ConstantValue* r = *rit;
        if (l && r) {
            if (!(*l == *r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    for (auto lit = typeParams.begin(), rit = other.typeParams.begin(); lit != typeParams.end();
         lit++, rit++) {
        const Type* l = *lit;
        const Type* r = *rit;
        if (l && r) {
            if (!l->isMatching(*r))
                return false;
        }
        else {
            if (l != r)
                return false;
        }
    }

    return true;
}